

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitm.c
# Opt level: O0

int mattackm(monst *magr,monst *mdef)

{
  permonst *mptr;
  bool bVar1;
  byte bVar2;
  byte bVar3;
  boolean bVar4;
  int iVar5;
  uint uVar6;
  obj *poVar7;
  monst *pmVar8;
  char *pcVar9;
  bool mhit;
  bool local_184;
  bool local_183;
  bool local_182;
  bool local_181;
  char *local_180;
  char local_178 [8];
  char buf [256];
  permonst *pd;
  permonst *pa;
  attack *paStack_60;
  attack alt_attk;
  attack *mattk;
  int res [6];
  int struck;
  int attk;
  int strike;
  int tmp;
  int i;
  monst *mdef_local;
  monst *magr_local;
  
  bVar2 = 0;
  if ((magr == (monst *)0x0) || (mdef == (monst *)0x0)) {
    return 0;
  }
  if (((*(uint *)&magr->field_0x60 >> 0x12 & 1) == 0) ||
     ((*(uint *)&magr->field_0x60 >> 0x13 & 1) != 0)) {
    return 0;
  }
  mptr = magr->data;
  buf._248_8_ = mdef->data;
  if (((mptr == mons + 0x78) && (magr->mx != mdef->mx)) && (magr->my != mdef->my)) {
    return 0;
  }
  iVar5 = find_mac(mdef);
  attk = iVar5 + (uint)magr->m_lev;
  if ((((*(uint *)&mdef->field_0x60 >> 0x15 & 1) != 0) ||
      ((*(uint *)&mdef->field_0x60 >> 0x12 & 1) == 0)) ||
     ((*(uint *)&mdef->field_0x60 >> 0x13 & 1) != 0)) {
    attk = attk + 4;
    *(uint *)&mdef->field_0x60 = *(uint *)&mdef->field_0x60 & 0xfff7ffff;
  }
  if ((*(uint *)&mdef->field_0x60 >> 7 & 1) != 0) {
    *(uint *)&mdef->field_0x60 = *(uint *)&mdef->field_0x60 & 0xffffff7f;
    newsym((int)mdef->mx,(int)mdef->my);
    if (mdef->wormno == '\0') {
      if ((viz_array[mdef->my][mdef->mx] & 2U) == 0) {
        if (((((u.uprops[0x1e].intrinsic != 0) ||
              ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
             (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
            ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
           (((u.uprops[0x40].intrinsic == 0 &&
             ((u.uprops[0x40].extrinsic == 0 && (((youmonst.data)->mflags3 & 0x100) == 0)))) ||
            ((mdef->data->mflags3 & 0x200) == 0)))) goto LAB_00214896;
        bVar3 = viz_array[mdef->my][mdef->mx] & 1;
        goto joined_r0x0021459f;
      }
    }
    else {
      bVar3 = worm_known(level,mdef);
joined_r0x0021459f:
      if (bVar3 == 0) goto LAB_00214896;
    }
    if (((((((*(uint *)&mdef->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
          (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
        ((((*(uint *)&mdef->field_0x60 >> 7 & 1) == 0 &&
          ((*(uint *)&mdef->field_0x60 >> 9 & 1) == 0)) && (((byte)u._1052_1_ >> 5 & 1) == 0)))) &&
       (((((mdef->data->mflags1 & 0x10000) != 0 ||
          ((poVar7 = which_armor(mdef,4), poVar7 != (obj *)0x0 &&
           (poVar7 = which_armor(mdef,4), poVar7->otyp == 0x4f)))) ||
         (((((u.uprops[0x1e].intrinsic == 0 &&
             (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
            ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) ||
           (((((u.uprops[0x19].intrinsic == 0 &&
               ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
              (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)) ||
            (u.uprops[0x19].blocked != 0)))) &&
          (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
           (iVar5 = dist2((int)mdef->mx,(int)mdef->my,(int)u.ux,(int)u.uy), 0x40 < iVar5)))))) &&
        (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
         (bVar4 = match_warn_of_mon(mdef), bVar4 == '\0')))))) {
      if (u.usleep == 0) {
        pcVar9 = a_monnam(mdef);
        pline("Suddenly, you notice %s.",pcVar9);
      }
      else {
        if ((mdef->data->geno & 0x1000) == 0) {
          pcVar9 = m_monnam(mdef);
          local_180 = makeplural(pcVar9);
        }
        else {
          local_180 = a_monnam(mdef);
        }
        pline("You dream of %s.",local_180);
      }
    }
  }
LAB_00214896:
  if (((mptr->mflags2 & 0x10) != 0) && ((*(uint *)(buf._248_8_ + 0x34) & 0x80) != 0)) {
    attk = attk + 1;
  }
  local_181 = false;
  if (((viz_array[magr->my][magr->mx] & 2U) == 0) ||
     (local_181 = false, (viz_array[mdef->my][mdef->mx] & 2U) == 0)) goto LAB_00215122;
  if (magr->wormno == '\0') {
    if (((viz_array[magr->my][magr->mx] & 2U) != 0) ||
       (((((u.uprops[0x1e].intrinsic == 0 &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
         ((u.uprops[0x40].intrinsic != 0 ||
          ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))))) &&
        (((magr->data->mflags3 & 0x200) != 0 && ((viz_array[magr->my][magr->mx] & 1U) != 0))))))
    goto LAB_00214a8f;
LAB_00214b24:
    if (((magr->data->mflags1 & 0x10000) == 0) &&
       ((poVar7 = which_armor(magr,4), poVar7 == (obj *)0x0 ||
        (poVar7 = which_armor(magr,4), poVar7->otyp != 0x4f)))) {
      if (((u.uprops[0x1e].intrinsic != 0) ||
          (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
           (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
         (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
          (((((u.uprops[0x19].intrinsic != 0 ||
              ((u.uprops[0x19].extrinsic != 0 || (youmonst.data == mons + 0x1e)))) ||
             (youmonst.data == mons + 0x31)) || (youmonst.data == mons + 0x32)) &&
           (local_182 = true, u.uprops[0x19].blocked == 0)))))) goto LAB_00215116;
      if ((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) {
        iVar5 = dist2((int)magr->mx,(int)magr->my,(int)u.ux,(int)u.uy);
        local_182 = true;
        if (iVar5 < 0x41) goto LAB_00215116;
      }
    }
    local_182 = true;
    if ((u.uprops[0x42].intrinsic == 0) && (local_182 = true, u.uprops[0x42].extrinsic == 0)) {
      bVar4 = match_warn_of_mon(magr);
      local_182 = true;
      if (bVar4 == '\0') {
        if (mdef->wormno == '\0') {
          if (((viz_array[mdef->my][mdef->mx] & 2U) != 0) ||
             ((((u.uprops[0x1e].intrinsic == 0 &&
                (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                 (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
               ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
              (((u.uprops[0x40].intrinsic != 0 ||
                ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
               (((mdef->data->mflags3 & 0x200) != 0 && ((viz_array[mdef->my][mdef->mx] & 1U) != 0)))
               ))))) goto LAB_00214e7d;
LAB_00214f12:
          if (((mdef->data->mflags1 & 0x10000) == 0) &&
             ((poVar7 = which_armor(mdef,4), poVar7 == (obj *)0x0 ||
              (poVar7 = which_armor(mdef,4), poVar7->otyp != 0x4f)))) {
            if ((((u.uprops[0x1e].intrinsic == 0) &&
                 (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                  (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
                 ((((u.uprops[0x19].intrinsic == 0 &&
                    ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
                   (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)))))) ||
               (local_184 = true, u.uprops[0x19].blocked != 0)) {
              if ((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) {
                iVar5 = dist2((int)mdef->mx,(int)mdef->my,(int)u.ux,(int)u.uy);
                local_184 = true;
                if (iVar5 < 0x41) goto LAB_002150fe;
              }
              goto LAB_002150b6;
            }
          }
          else {
LAB_002150b6:
            local_184 = true;
            if ((u.uprops[0x42].intrinsic == 0) && (local_184 = true, u.uprops[0x42].extrinsic == 0)
               ) {
              bVar4 = match_warn_of_mon(mdef);
              local_184 = bVar4 != '\0';
            }
          }
LAB_002150fe:
          local_183 = local_184;
        }
        else {
          bVar4 = worm_known(level,mdef);
          if (bVar4 == '\0') goto LAB_00214f12;
LAB_00214e7d:
          if (((((((*(uint *)&mdef->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
                (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
              (((*(uint *)&mdef->field_0x60 >> 7 & 1) != 0 ||
               ((*(uint *)&mdef->field_0x60 >> 9 & 1) != 0)))) ||
             (local_183 = true, ((byte)u._1052_1_ >> 5 & 1) != 0)) goto LAB_00214f12;
        }
        local_182 = local_183;
      }
    }
  }
  else {
    bVar4 = worm_known(level,magr);
    if (bVar4 == '\0') goto LAB_00214b24;
LAB_00214a8f:
    if ((((((*(uint *)&magr->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
         (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
       ((((*(uint *)&magr->field_0x60 >> 7 & 1) != 0 || ((*(uint *)&magr->field_0x60 >> 9 & 1) != 0)
         ) || (local_182 = true, ((byte)u._1052_1_ >> 5 & 1) != 0)))) goto LAB_00214b24;
  }
LAB_00215116:
  local_181 = local_182;
LAB_00215122:
  vis = local_181;
  magr->mlstmv = moves;
  strike = 0;
  do {
    if (5 < strike) {
      return (uint)bVar2;
    }
    res[(long)strike + -2] = 0;
    paStack_60 = getmattk(mptr,strike,(int *)&mattk,(attack *)((long)&pa + 4));
    otmp = (obj *)0x0;
    bVar1 = true;
    uVar6 = (uint)paStack_60->aatyp;
    if (uVar6 - 1 < 6) goto LAB_002152a1;
    if (uVar6 == 7) {
      mhit = false;
      if ((1 < strike) && (mhit = false, res[(long)(strike + -1) + -2] == 1)) {
        mhit = res[(long)(strike + -2) + -2] == 1;
      }
      if (mhit) {
        iVar5 = hitmm(magr,mdef,paStack_60);
        res[(long)strike + -2] = iVar5;
      }
    }
    else if (uVar6 == 0xb) {
      if ((u.usteed == (monst *)0x0) || (mdef != u.usteed)) {
        if (((u._1052_1_ & 1) == 0) || (magr != u.ustuck)) {
          iVar5 = rnd(strike + 0x14);
          mhit = iVar5 < attk;
          if (mhit) {
            iVar5 = gulpmm(magr,mdef,paStack_60);
            res[(long)strike + -2] = iVar5;
          }
          else {
            missmm(magr,mdef,paStack_60);
          }
        }
        else {
          mhit = false;
        }
      }
      else {
        mhit = false;
      }
    }
    else if (uVar6 == 0xd) {
      iVar5 = explmm(magr,mdef,paStack_60);
      res[(long)strike + -2] = iVar5;
      mhit = res[(long)strike + -2] != 0;
      bVar1 = mhit;
    }
    else if (uVar6 == 0xf) {
      mhit = false;
      iVar5 = gazemm(magr,mdef,paStack_60);
      res[(long)strike + -2] = iVar5;
    }
    else {
      if (uVar6 != 0x10) {
        if (uVar6 != 0xfe) {
          mhit = false;
          bVar1 = false;
          goto LAB_002156e5;
        }
        if ((magr->weapon_check == '\x01') || (magr->mw == (obj *)0x0)) {
          magr->weapon_check = '\x03';
          iVar5 = mon_wield_item(magr);
          if (iVar5 != 0) {
            return 0;
          }
        }
        possibly_unwield(magr,'\0');
        otmp = magr->mw;
        if (otmp != (obj *)0x0) {
          if (vis != '\0') {
            mswingsm(magr,mdef,otmp);
          }
          iVar5 = hitval(otmp,mdef);
          attk = iVar5 + attk;
        }
      }
LAB_002152a1:
      iVar5 = distmin((int)magr->mx,(int)magr->my,(int)mdef->mx,(int)mdef->my);
      if (1 < iVar5) {
        return 0;
      }
      if ((((((*(uint *)&magr->field_0x60 >> 0x15 & 1) == 0) && (u.uprops[0x15].intrinsic == 0)) &&
           (u.uprops[0x15].extrinsic == 0)) && (otmp != (obj *)0x0)) &&
         (((mdef->data == mons + 0xdb &&
           ((paStack_60->aatyp == 0xfe || ((magr->mintrinsics & 8) == 0)))) ||
          ((paStack_60->aatyp != 0xfe && ((mdef->data == mons + 0xc || (mdef->data == mons + 0xb))))
          )))) {
        mhit = false;
      }
      else {
        dieroll = rnd(strike + 0x14);
        mhit = dieroll < attk;
        if (otmp != (obj *)0x0) {
          iVar5 = hitval(otmp,mdef);
          attk = attk - iVar5;
        }
        if (mhit) {
          iVar5 = hitmm(magr,mdef,paStack_60);
          res[(long)strike + -2] = iVar5;
          if (((((mdef->data == mons + 0xd6) || (mdef->data == mons + 0xd5)) && (otmp != (obj *)0x0)
               ) && (((*(ushort *)&objects[otmp->otyp].field_0x11 >> 4 & 0x1f) == 0xb &&
                     (1 < mdef->mhp)))) &&
             (((*(uint *)&mdef->field_0x60 >> 8 & 1) == 0 &&
              ((pmVar8 = clone_mon(mdef,'\0','\0'), pmVar8 != (monst *)0x0 && (vis != '\0')))))) {
            pcVar9 = Monnam(mdef);
            strcpy(local_178,pcVar9);
            pcVar9 = mon_nam(magr);
            pline("%s divides as %s hits it!",local_178,pcVar9);
          }
        }
        else {
          missmm(magr,mdef,paStack_60);
        }
      }
    }
LAB_002156e5:
    if ((bVar1) && ((res[(long)strike + -2] & 4U) == 0)) {
      iVar5 = passivemm(magr,mdef,mhit,res[(long)strike + -2] & 2);
      res[(long)strike + -2] = iVar5;
    }
    if ((res[(long)strike + -2] & 2U) != 0) {
      return res[(long)strike + -2];
    }
    if (mhit) {
      *(uint *)&mdef->field_0x60 = *(uint *)&mdef->field_0x60 & 0xfff7ffff;
    }
    if ((res[(long)strike + -2] & 4U) != 0) {
      return res[(long)strike + -2];
    }
    if (((*(uint *)&magr->field_0x60 >> 0x12 & 1) == 0) ||
       ((*(uint *)&magr->field_0x60 >> 0x13 & 1) != 0)) {
      return res[(long)strike + -2];
    }
    if ((res[(long)strike + -2] & 1U) != 0) {
      bVar2 = 1;
    }
    strike = strike + 1;
  } while( true );
}

Assistant:

int mattackm(struct monst *magr, struct monst *mdef)
{
    int		    i,		/* loop counter */
		    tmp,	/* amour class difference */
		    strike,	/* hit this attack */
		    attk,	/* attack attempted this time */
		    struck = 0,	/* hit at least once */
		    res[NATTK];	/* results of all attacks */
    const struct attack *mattk;
    struct attack alt_attk;
    const struct permonst *pa, *pd;

    if (!magr || !mdef) return MM_MISS;		/* mike@genat */
    if (!magr->mcanmove || magr->msleeping) return MM_MISS;
    pa = magr->data;
    pd = mdef->data;

    /* Grid bugs cannot attack at an angle. */
    if (pa == &mons[PM_GRID_BUG] && magr->mx != mdef->mx
						&& magr->my != mdef->my)
	return MM_MISS;

    /* Calculate the armour class differential. */
    tmp = find_mac(mdef) + magr->m_lev;
    if (mdef->mconf || !mdef->mcanmove || mdef->msleeping) {
	tmp += 4;
	mdef->msleeping = 0;
    }

    /* undetect monsters become un-hidden if they are attacked */
    if (mdef->mundetected) {
	mdef->mundetected = 0;
	newsym(mdef->mx, mdef->my);
	if (canseemon(level, mdef) && !sensemon(mdef)) {
	    if (u.usleep) pline("You dream of %s.",
				(mdef->data->geno & G_UNIQ) ?
				a_monnam(mdef) : makeplural(m_monnam(mdef)));
	    else pline("Suddenly, you notice %s.", a_monnam(mdef));
	}
    }

    /* Elves hate orcs. */
    if (is_elf(pa) && is_orc(pd)) tmp++;


    /* Set up the visibility of action */
    vis = (cansee(magr->mx,magr->my) && cansee(mdef->mx,mdef->my) && (canspotmon(level, magr) || canspotmon(level, mdef)));

    /*	Set flag indicating monster has moved this turn.  Necessary since a
     *	monster might get an attack out of sequence (i.e. before its move) in
     *	some cases, in which case this still counts as its move for the round
     *	and it shouldn't move again.
     */
    magr->mlstmv = moves;

    /* Now perform all attacks for the monster. */
    for (i = 0; i < NATTK; i++) {
	res[i] = MM_MISS;
	mattk = getmattk(pa, i, res, &alt_attk);
	otmp = NULL;
	attk = 1;
	switch (mattk->aatyp) {
	    case AT_WEAP:		/* "hand to hand" attacks */
		if (magr->weapon_check == NEED_WEAPON || !MON_WEP(magr)) {
		    magr->weapon_check = NEED_HTH_WEAPON;
		    if (mon_wield_item(magr) != 0) return 0;
		}
		possibly_unwield(magr, FALSE);
		otmp = MON_WEP(magr);

		if (otmp) {
		    if (vis) mswingsm(magr, mdef, otmp);
		    tmp += hitval(otmp, mdef);
		}
		/* fall through */
	    case AT_CLAW:
	    case AT_KICK:
	    case AT_BITE:
	    case AT_STNG:
	    case AT_TUCH:
	    case AT_BUTT:
	    case AT_TENT:
		/* Nymph that teleported away on first attack? */
		if (distmin(magr->mx,magr->my,mdef->mx,mdef->my) > 1)
		    return MM_MISS;
		/* Monsters won't attack cockatrices physically if they
		 * have a weapon instead.  They won't attack
		 * disintegrators with a weapon either.  This instinct
		 * doesn't work for players, or under conflict or
		 * confusion.
		 */
		if (!magr->mconf && !Conflict && otmp &&
		    ((touch_disintegrates(mdef->data) &&
		      (mattk->aatyp == AT_WEAP || !resists_disint(magr))) ||
		     (mattk->aatyp != AT_WEAP && touch_petrifies(mdef->data)))) {
		    strike = 0;
		    break;
		}
		dieroll = rnd(20 + i);
		strike = (tmp > dieroll);
		/* KMH -- don't accumulate to-hit bonuses */
		if (otmp)
		    tmp -= hitval(otmp, mdef);
		if (strike) {
		    res[i] = hitmm(magr, mdef, mattk);
		    if ((mdef->data == &mons[PM_BLACK_PUDDING] || mdef->data == &mons[PM_BROWN_PUDDING])
		       && otmp && objects[otmp->otyp].oc_material == IRON
		       && mdef->mhp > 1 && !mdef->mcan)
		    {
			if (clone_mon(mdef, 0, 0)) {
			    if (vis) {
				char buf[BUFSZ];

				strcpy(buf, Monnam(mdef));
				pline("%s divides as %s hits it!", buf, mon_nam(magr));
			    }
			}
		    }
		} else
		    missmm(magr, mdef, mattk);
		break;

	    case AT_HUGS:	/* automatic if prev two attacks succeed */
		strike = (i >= 2 && res[i-1] == MM_HIT && res[i-2] == MM_HIT);
		if (strike)
		    res[i] = hitmm(magr, mdef, mattk);

		break;

	    case AT_GAZE:
		strike = 0;	/* will not wake up a sleeper */
		res[i] = gazemm(magr, mdef, mattk);
		break;

	    case AT_EXPL:
		res[i] = explmm(magr, mdef, mattk);
		if (res[i] == MM_MISS) { /* cancelled--no attack */
		    strike = 0;
		    attk = 0;
		} else
		    strike = 1;	/* automatic hit */
		break;

	    case AT_ENGL:
		if (u.usteed && (mdef == u.usteed)) {
		    strike = 0;
		    break;
		} 
		/* Engulfing attacks are directed at the hero if
		 * possible. -dlc
		 */
		if (u.uswallow && magr == u.ustuck)
		    strike = 0;
		else {
		    if ((strike = (tmp > rnd(20+i))))
			res[i] = gulpmm(magr, mdef, mattk);
		    else
			missmm(magr, mdef, mattk);
		}
		break;

	    default:		/* no attack */
		strike = 0;
		attk = 0;
		break;
	}

	if (attk && !(res[i] & MM_AGR_DIED))
	    res[i] = passivemm(magr, mdef, strike, res[i] & MM_DEF_DIED);

	if (res[i] & MM_DEF_DIED) return res[i];

	/*
	 *  Wake up the defender.  NOTE:  this must follow the check
	 *  to see if the defender died.  We don't want to modify
	 *  unallocated monsters!
	 */
	if (strike) mdef->msleeping = 0;

	if (res[i] & MM_AGR_DIED)  return res[i];
	/* return if aggressor can no longer attack */
	if (!magr->mcanmove || magr->msleeping) return res[i];
	if (res[i] & MM_HIT) struck = 1;	/* at least one hit */
    }

    return struck ? MM_HIT : MM_MISS;
}